

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O0

void __thiscall Memory::LargeHeapBlock::FinalizeAllObjects(LargeHeapBlock *this)

{
  code *pcVar1;
  byte bVar2;
  bool bVar3;
  LargeObjectHeader *pLVar4;
  long *plVar5;
  LargeObjectHeader *pLVar6;
  LargeObjectHeader **ppLVar7;
  undefined8 *in_FS_OFFSET;
  void *objectAddress;
  LargeObjectHeader *header_1;
  FinalizableObject *finalizableObject;
  LargeObjectHeader *header;
  uint i;
  uint processedCount;
  LargeHeapBlock *this_local;
  
  if (this->finalizeCount != 0) {
    header._4_4_ = 0;
    for (header._0_4_ = 0; (uint)header < this->allocCount; header._0_4_ = (uint)header + 1) {
      pLVar4 = GetHeaderByIndex(this,(uint)header);
      if ((pLVar4 != (LargeObjectHeader *)0x0) &&
         (bVar2 = LargeObjectHeader::GetAttributes(pLVar4,this->heapInfo->recycler->Cookie),
         (bVar2 & 0x80) != 0)) {
        plVar5 = (long *)LargeObjectHeader::GetAddress(pLVar4);
        (**(code **)*plVar5)(plVar5,1);
        (**(code **)(*plVar5 + 8))(plVar5,1);
        this->heapInfo->liveFinalizableObjectCount = this->heapInfo->liveFinalizableObjectCount - 1;
        header._4_4_ = header._4_4_ + 1;
      }
    }
    while (this->pendingDisposeObject != (LargeObjectHeader *)0x0) {
      pLVar4 = this->pendingDisposeObject;
      pLVar6 = LargeObjectHeader::GetNext(pLVar4,this->heapInfo->recycler->Cookie);
      this->pendingDisposeObject = pLVar6;
      bVar2 = LargeObjectHeader::GetAttributes(pLVar4,this->heapInfo->recycler->Cookie);
      if ((bVar2 & 0x80) == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *(undefined4 *)*in_FS_OFFSET = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                           ,0x11f,
                           "(header->GetAttributes(this->heapInfo->recycler->Cookie) & FinalizeBit)"
                           ,"header->GetAttributes(this->heapInfo->recycler->Cookie) & FinalizeBit")
        ;
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *(undefined4 *)*in_FS_OFFSET = 0;
      }
      ppLVar7 = HeaderList(this);
      if (ppLVar7[pLVar4->objectIndex] != (LargeObjectHeader *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *(undefined4 *)*in_FS_OFFSET = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                           ,0x120,"(this->HeaderList()[header->objectIndex] == nullptr)",
                           "this->HeaderList()[header->objectIndex] == nullptr");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *(undefined4 *)*in_FS_OFFSET = 0;
      }
      plVar5 = (long *)LargeObjectHeader::GetAddress(pLVar4);
      (**(code **)(*plVar5 + 8))(plVar5,1);
      this->heapInfo->liveFinalizableObjectCount = this->heapInfo->liveFinalizableObjectCount - 1;
      this->heapInfo->pendingDisposableObjectCount =
           this->heapInfo->pendingDisposableObjectCount - 1;
      header._4_4_ = header._4_4_ + 1;
    }
    if (this->finalizeCount != header._4_4_) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                         ,299,"(this->finalizeCount == processedCount)",
                         "this->finalizeCount == processedCount");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
  }
  return;
}

Assistant:

void
LargeHeapBlock::FinalizeAllObjects()
{
    if (this->finalizeCount != 0)
    {
        DebugOnly(uint processedCount = 0);
        for (uint i = 0; i < allocCount; i++)
        {
            LargeObjectHeader * header = this->GetHeaderByIndex(i);
            if (header == nullptr || ((header->GetAttributes(this->heapInfo->recycler->Cookie) & FinalizeBit) == 0))
            {
                continue;
            }

            FinalizableObject * finalizableObject = ((FinalizableObject *)header->GetAddress());

            finalizableObject->Finalize(true);
            finalizableObject->Dispose(true);
#ifdef RECYCLER_FINALIZE_CHECK
            this->heapInfo->liveFinalizableObjectCount--;
#endif
            DebugOnly(processedCount++);
        }

        while (pendingDisposeObject != nullptr)
        {
            LargeObjectHeader * header = pendingDisposeObject;
            pendingDisposeObject = header->GetNext(this->heapInfo->recycler->Cookie);
            Assert(header->GetAttributes(this->heapInfo->recycler->Cookie) & FinalizeBit);
            Assert(this->HeaderList()[header->objectIndex] == nullptr);

            void * objectAddress = header->GetAddress();
            ((FinalizableObject *)objectAddress)->Dispose(true);
#ifdef RECYCLER_FINALIZE_CHECK
            this->heapInfo->liveFinalizableObjectCount--;
            this->heapInfo->pendingDisposableObjectCount--;
#endif
            DebugOnly(processedCount++);
        }

        Assert(this->finalizeCount == processedCount);
    }
}